

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O3

void __thiscall
ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
subscribe(Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
          *this,Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                *s)

{
  mutex *__mutex;
  int iVar1;
  mapped_type *ppSVar2;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *this_00;
  undefined8 uVar3;
  size_t id;
  size_t local_20;
  
  __mutex = &this->m;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    local_20 = s->id;
    ppSVar2 = std::
              map<unsigned_long,_ps::Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ps::Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_*>_>_>
              ::operator[](&this->subs,&local_20);
    *ppSVar2 = s;
    this_00 = &std::
               map<unsigned_long,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               ::operator[](&this->signals,&local_20)->_M_t;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
              (this_00);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar3 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

void subscribe(Subscriber<T>* s)
		{
			std::lock_guard<std::mutex> l{m};
			const auto id = s->get_id();
			subs[id] = s;
			signals[id].clear();
		}